

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

bool __thiscall
duckdb::CanScaleDownDecimal<duckdb::hugeint_t>
          (duckdb *this,hugeint_t input,
          DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t> *data)

{
  bool bVar1;
  long lVar2;
  hugeint_t *rhs;
  hugeint_t rounded_input;
  hugeint_t local_68;
  hugeint_t value;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t input_local;
  
  input_local.upper = input.lower;
  lVar2 = (ulong)*(byte *)(input.upper + 0x41) * 0x10;
  local_48.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar2);
  local_48.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar2 + 8);
  input_local.lower = (uint64_t)this;
  value = hugeint_t::operator%(&input_local,&local_48);
  rounded_input.lower = input_local.lower;
  rounded_input.upper = input_local.upper;
  hugeint_t::hugeint_t(&local_68,0);
  bVar1 = hugeint_t::operator<(&rounded_input,&local_68);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_68,-1);
    hugeint_t::operator*=(&rounded_input,&local_68);
    hugeint_t::hugeint_t(&local_68,-1);
    hugeint_t::operator*=(&value,&local_68);
  }
  hugeint_t::hugeint_t(&local_38,2);
  local_68 = hugeint_t::operator/(&local_48,&local_38);
  bVar1 = hugeint_t::operator>=(&value,&local_68);
  if (bVar1) {
    hugeint_t::operator+=(&rounded_input,&local_48);
  }
  rhs = (hugeint_t *)(input.upper + 0x20);
  bVar1 = hugeint_t::operator<(&rounded_input,rhs);
  if (bVar1) {
    local_68 = hugeint_t::operator-(rhs);
    bVar1 = hugeint_t::operator>(&rounded_input,&local_68);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CanScaleDownDecimal<hugeint_t>(hugeint_t input, DecimalScaleInput<hugeint_t> &data) {
	auto divisor = UnsafeNumericCast<hugeint_t>(Hugeint::POWERS_OF_TEN[data.source_scale]);
	hugeint_t value = input % divisor;
	hugeint_t rounded_input = input;
	if (rounded_input < 0) {
		rounded_input *= -1;
		value *= -1;
	}
	if (value >= divisor / 2) {
		rounded_input += divisor;
	}
	return rounded_input < data.limit && rounded_input > -data.limit;
}